

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTestCase.cpp
# Opt level: O2

void __thiscall tcu::TestNode::addChild(TestNode *this,TestNode *node)

{
  TestNode *local_8;
  
  local_8 = node;
  std::vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>::push_back
            (&this->m_children,&local_8);
  return;
}

Assistant:

void TestNode::addChild (TestNode* node)
{
	// Child names must be unique!
	// \todo [petri] O(n^2) algorithm, but shouldn't really matter..
#if defined(DE_DEBUG)
	for (int i = 0; i < (int)m_children.size(); i++)
	{
		if (deStringEqual(node->getName(), m_children[i]->getName()))
			throw tcu::InternalError(std::string("Test case with non-unique name '") + node->getName() + "' added to group '" + getName() + "'.");
	}
#endif

	// children only in group nodes
	DE_ASSERT(getTestNodeTypeClass(m_nodeType) == NODECLASS_GROUP);

	// children must have the same class
	if (!m_children.empty())
		DE_ASSERT(getTestNodeTypeClass(m_children.front()->getNodeType()) == getTestNodeTypeClass(node->getNodeType()));

	m_children.push_back(node);
}